

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_depth_decomposition.h
# Opt level: O3

ArrayIDIDFunc *
compute_tree_depth_order<main::__0>
          (ArrayIDIDFunc *__return_storage_ptr__,ArrayIDIDFunc *tail,ArrayIDIDFunc *head,
          anon_class_8_1_f6d195b4 *compute_separator,int tree_depth_must_be_below)

{
  uint uVar1;
  uint node_end;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ArrayIDIDFunc *pAVar5;
  bool bVar6;
  int *piVar7;
  void *__s;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ArrayIDIDFunc *extraout_RAX;
  ArrayIDIDFunc *extraout_RAX_00;
  int *piVar9;
  ArrayIDIDFunc *extraout_RAX_01;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int order_end;
  ArrayIDIDFunc to_input_id;
  int local_bc;
  int **local_b8;
  ArrayIDIDFunc *local_b0;
  int local_a4;
  ArrayIDIDFunc local_a0;
  ArrayIDIDFunc local_88;
  anon_class_32_4_d72f82c3 local_70;
  anon_class_32_4_cb35006c local_50;
  ArrayIDIDFunc *pAVar8;
  
  uVar1 = tail->image_count_;
  uVar12 = (ulong)uVar1;
  (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = uVar1;
  local_b0 = __return_storage_ptr__;
  local_a4 = tree_depth_must_be_below;
  if (uVar12 == 0) {
    local_b8 = &(__return_storage_ptr__->super_ArrayIDFunc<int>).data_;
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = (int *)0x0;
    __return_storage_ptr__->image_count_ = 0;
    local_bc = 0;
    local_a0.super_ArrayIDFunc<int>.preimage_count_ = 0;
    local_a0.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    local_a0.image_count_ = 0;
  }
  else {
    uVar14 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar14 = uVar12 * 4;
    }
    piVar7 = (int *)operator_new__(uVar14);
    local_b8 = &(__return_storage_ptr__->super_ArrayIDFunc<int>).data_;
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = piVar7;
    __return_storage_ptr__->image_count_ = uVar1;
    local_bc = 0;
    local_a0.super_ArrayIDFunc<int>.preimage_count_ = uVar1;
    local_a0.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar14);
    local_a0.image_count_ = uVar1;
    if (0 < (int)uVar1) {
      auVar18 = vpbroadcastq_avx512vl();
      auVar3 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar4 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      lVar11 = 0;
      auVar19._8_8_ = 8;
      auVar19._0_8_ = 8;
      auVar19._16_8_ = 8;
      auVar19._24_8_ = 8;
      auVar21._8_4_ = 8;
      auVar21._0_8_ = 0x800000008;
      auVar21._12_4_ = 8;
      auVar21._16_4_ = 8;
      auVar21._20_4_ = 8;
      auVar21._24_4_ = 8;
      auVar21._28_4_ = 8;
      do {
        vpcmpuq_avx512vl(auVar4,auVar18,2);
        vpcmpuq_avx512vl(auVar3,auVar18,2);
        auVar20 = vmovdqu32_avx512vl(auVar2);
        *(undefined1 (*) [32])((long)local_a0.super_ArrayIDFunc<int>.data_ + lVar11) = auVar20;
        auVar4 = vpaddq_avx2(auVar4,auVar19);
        auVar3 = vpaddq_avx2(auVar3,auVar19);
        auVar2 = vpaddd_avx2(auVar2,auVar21);
        lVar11 = lVar11 + 0x20;
      } while ((ulong)(uVar1 + 7 >> 3) << 5 != lVar11);
    }
  }
  pAVar8 = local_b0;
  inplace_reorder_nodes_and_arc_in_preorder(tail,head,&local_a0);
  local_88.super_ArrayIDFunc<int>.preimage_count_ = uVar1;
  if (uVar1 == 0) {
    local_88.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    local_88.image_count_ = 0;
  }
  else {
    uVar14 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar14 = uVar12 * 4;
    }
    local_88.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar14);
    local_88.image_count_ = uVar1;
    if (0 < (int)uVar1) {
      auVar18 = vpbroadcastq_avx512vl();
      auVar3 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar4 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      lVar11 = 0;
      auVar20._8_8_ = 8;
      auVar20._0_8_ = 8;
      auVar20._16_8_ = 8;
      auVar20._24_8_ = 8;
      auVar22._8_4_ = 8;
      auVar22._0_8_ = 0x800000008;
      auVar22._12_4_ = 8;
      auVar22._16_4_ = 8;
      auVar22._20_4_ = 8;
      auVar22._24_4_ = 8;
      auVar22._28_4_ = 8;
      do {
        vpcmpuq_avx512vl(auVar4,auVar18,2);
        vpcmpuq_avx512vl(auVar3,auVar18,2);
        auVar19 = vmovdqu32_avx512vl(auVar2);
        *(undefined1 (*) [32])((long)local_88.super_ArrayIDFunc<int>.data_ + lVar11) = auVar19;
        auVar4 = vpaddq_avx2(auVar4,auVar20);
        auVar3 = vpaddq_avx2(auVar3,auVar20);
        auVar2 = vpaddd_avx2(auVar2,auVar22);
        lVar11 = lVar11 + 0x20;
      } while ((ulong)(uVar1 + 7 >> 3) << 5 != lVar11);
    }
  }
  local_50.tree_depth_must_be_below = &local_a4;
  local_50.order_end = &local_bc;
  uVar1 = (tail->super_ArrayIDFunc<int>).preimage_count_;
  node_end = tail->image_count_;
  local_50.compute_separator = (FastComputeSeparator *)compute_separator;
  local_50.order = pAVar8;
  if (node_end + 0x7e < 0x7f) {
    __s = (void *)0x0;
  }
  else {
    uVar13 = node_end + 0x3f;
    if ((int)(node_end + 0x3f) < 0) {
      uVar13 = node_end + 0x7e;
    }
    uVar12 = 0xffffffffffffffff;
    if (-0x7f < (int)node_end) {
      uVar12 = (ulong)(uint)((int)uVar13 >> 6) * 8;
    }
    __s = operator_new__(uVar12);
    memset(__s,0xff,(long)((int)uVar13 >> 6) << 3);
  }
  if (0 < (int)uVar1) {
    piVar7 = (head->super_ArrayIDFunc<int>).data_;
    piVar9 = (tail->super_ArrayIDFunc<int>).data_;
    uVar12 = 0;
    do {
      uVar13 = piVar9[uVar12];
      if (piVar7[uVar12] < (int)uVar13) {
        uVar16 = uVar13 + 0x3f;
        if (-1 < (int)uVar13) {
          uVar16 = uVar13;
        }
        uVar14 = *(ulong *)((long)__s + (long)((int)uVar16 >> 6) * 8);
        *(ulong *)((long)__s + (long)((int)uVar16 >> 6) * 8) =
             (ulong)((uint)(uVar14 >> ((ulong)uVar13 & 0x3f)) & 1) << ((ulong)uVar13 & 0x3f) ^
             uVar14;
      }
      uVar12 = uVar12 + 1;
    } while (uVar1 != uVar12);
  }
  local_70.input_node_id = &local_88;
  local_70.callback = &local_50;
  iVar15 = 0;
  uVar13 = 0;
  local_70.tail = tail;
  local_70.head = head;
  if (1 < (int)node_end) {
    uVar13 = 0;
    uVar12 = 1;
    iVar15 = 0;
    do {
      iVar17 = (int)uVar12;
      if ((*(ulong *)((long)__s + (uVar12 >> 6) * 8) >> (uVar12 & 0x3f) & 1) != 0) {
        uVar16 = uVar13;
        if ((int)uVar13 < (int)uVar1) {
          lVar11 = 0;
          do {
            if (iVar17 <= (tail->super_ArrayIDFunc<int>).data_[(int)uVar13 + lVar11]) {
              uVar16 = (int)lVar11 + uVar13;
              break;
            }
            lVar11 = lVar11 + 1;
            uVar16 = uVar1;
          } while ((long)(int)uVar1 - (long)(int)uVar13 != lVar11);
        }
        bVar6 = forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:396:9)>
                ::anon_class_32_4_d72f82c3::operator()(&local_70,iVar15,iVar17,uVar13,uVar16);
        pAVar8 = (ArrayIDIDFunc *)CONCAT71(extraout_var,bVar6);
        iVar15 = iVar17;
        uVar13 = uVar16;
        if (!bVar6) goto LAB_00119654;
      }
      uVar12 = (ulong)(iVar17 + 1U);
    } while (iVar17 + 1U != node_end);
  }
  bVar6 = forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:396:9)>
          ::anon_class_32_4_d72f82c3::operator()(&local_70,iVar15,node_end,uVar13,uVar1);
  pAVar8 = (ArrayIDIDFunc *)CONCAT71(extraout_var_00,bVar6);
LAB_00119654:
  if (__s != (void *)0x0) {
    operator_delete__(__s);
    pAVar8 = extraout_RAX;
  }
  pAVar5 = local_b0;
  if (local_88.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_88.super_ArrayIDFunc<int>.data_);
    pAVar8 = extraout_RAX_00;
  }
  iVar15 = (pAVar5->super_ArrayIDFunc<int>).preimage_count_;
  lVar11 = (long)iVar15;
  if (lVar11 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (-1 < iVar15) {
      uVar12 = lVar11 * 4;
    }
    piVar9 = (int *)operator_new__(uVar12);
    piVar7 = *local_b8;
    memmove(piVar9,piVar7,lVar11 * 4);
    iVar17 = local_a0.image_count_;
    if (0 < iVar15) {
      lVar10 = 0;
      do {
        piVar9[lVar10] = local_a0.super_ArrayIDFunc<int>.data_[piVar9[lVar10]];
        lVar10 = lVar10 + 1;
      } while (lVar11 != lVar10);
    }
    if (piVar7 != (int *)0x0) {
      operator_delete__(piVar7);
    }
    (local_b0->super_ArrayIDFunc<int>).preimage_count_ = iVar15;
    (local_b0->super_ArrayIDFunc<int>).data_ = piVar9;
    local_b0->image_count_ = iVar17;
    pAVar8 = local_b0;
  }
  if (local_a0.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_a0.super_ArrayIDFunc<int>.data_);
    pAVar8 = extraout_RAX_01;
  }
  return pAVar8;
}

Assistant:

ArrayIDIDFunc compute_tree_depth_order(
    ArrayIDIDFunc tail, ArrayIDIDFunc head,
    const ComputeSeparator& compute_separator,
    int tree_depth_must_be_below)
{
    assert(tail.preimage_count() == head.preimage_count());
    assert(tail.image_count() == head.image_count());
    assert(is_symmetric(tail, head));

    const int node_count = tail.image_count();
    const int arc_count = tail.preimage_count();
    (void)arc_count;

    ArrayIDIDFunc order(node_count, node_count);
    int order_end = 0;

    ArrayIDIDFunc to_input_id = identity_permutation(node_count);
    inplace_reorder_nodes_and_arc_in_preorder(tail, head, to_input_id);
    forall_connected_components_with_nodes_and_arcs_in_preorder(
        tail, head, identity_permutation(node_count),
        [&](ArrayIDIDFunc sub_tail, ArrayIDIDFunc sub_head,
            ArrayIDIDFunc sub_to_super) {
            int sub_node_count = sub_tail.image_count();
            ArrayIDIDFunc sub_order = compute_tree_depth_order_of_connected_graph(
                std::move(sub_tail), std::move(sub_head), compute_separator,
                tree_depth_must_be_below);
            if(sub_order.preimage_count() != 0){
                for (int i = 0; i < sub_node_count; ++i)
                    order[order_end++] = sub_to_super[sub_order[i]];
                return true;
            }else{
                order = ArrayIDIDFunc();
                return false;
            }
        });
    if(order.preimage_count() != 0){
        assert(order_end == node_count);
        order = chain(order, to_input_id);
    }
    return order;
}